

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetLeaderContentAngleRadians(ON_DimStyle *this,double angle_radians)

{
  double local_18;
  double angle_radians_local;
  ON_DimStyle *this_local;
  
  if ((angle_radians < -6.5973445725385655) ||
     (local_18 = angle_radians, 6.5973445725385655 < angle_radians)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x11c7,"","Invalid angle_radians parameter in ON_DimStyle::SetContentAngle().");
  }
  else {
    for (; local_18 < 0.0; local_18 = local_18 + 6.283185307179586) {
    }
    for (; 6.283185307179586 <= local_18; local_18 = local_18 - 6.283185307179586) {
    }
    Internal_SetDoubleMember(this,LeaderContentAngle,local_18,&this->m_leader_content_angle);
  }
  return;
}

Assistant:

void ON_DimStyle::SetLeaderContentAngleRadians(double angle_radians)
{
  if (!(angle_radians >= -2.1*ON_PI && angle_radians <= 2.1*ON_PI))
  {
    ON_ERROR("Invalid angle_radians parameter in ON_DimStyle::SetContentAngle().");
    return;
  }
  
  // positive value so commpare function will work as expected.
  while (angle_radians < 0.0)
    angle_radians += 2.0*ON_PI;
  while (angle_radians >= 2.0*ON_PI)
    angle_radians -= 2.0*ON_PI;

  Internal_SetDoubleMember(ON_DimStyle::field::LeaderContentAngle, angle_radians, m_leader_content_angle);
}